

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Color *this;
  ostream *poVar1;
  rep rVar2;
  allocator<char> local_16d1;
  string local_16d0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_16b0;
  duration<long,_std::ratio<1L,_1L>_> local_16a8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_16a0;
  time_point stop;
  Framebuffer image;
  time_point start;
  undefined1 local_15f8 [8];
  Tuple4d up;
  Tuple4d to;
  Tuple4d from;
  Camera camera;
  Color local_14d8;
  undefined1 local_14c0 [8];
  PointLight fill;
  Color local_1460;
  undefined1 local_1448 [8];
  PointLight key;
  ColorMaterial local_13f0;
  undefined1 local_1398 [32];
  Matrix4d local_1378;
  undefined1 local_12f8 [8];
  Group spheres;
  shared_ptr<material::Material> local_11f0;
  Matrix4d local_11e0;
  Matrix4d local_1160;
  Matrix4d local_10e0;
  Matrix4d local_1060;
  undefined1 local_fe0 [8];
  Sphere left;
  shared_ptr<material::Material> local_f30;
  Matrix4d local_f20;
  Matrix4d local_ea0;
  Matrix4d local_e20;
  undefined1 local_da0 [8];
  Sphere right;
  shared_ptr<material::Material> local_cf0;
  Matrix4d local_ce0;
  Matrix4d local_c60;
  undefined1 local_be0 [8];
  Sphere middle;
  shared_ptr<material::Material> local_b30;
  Matrix4d local_b20;
  undefined1 local_aa0 [8];
  Plane floor;
  Color local_980;
  Color local_968;
  undefined1 local_950 [8];
  CheckerMaterial grid;
  Matrix4d local_7e0;
  Matrix4d local_760;
  Matrix4d local_6e0;
  Color local_660;
  Color local_648;
  undefined1 local_630 [8];
  RingMaterial ring;
  Matrix4d local_4c0;
  Matrix4d local_440;
  Color local_3c0;
  Color local_3a8;
  undefined1 local_390 [8];
  GradientMaterial gradient;
  Matrix4d local_220;
  Color local_1a0;
  Color local_178;
  undefined1 local_160 [8];
  StripeMaterial stripes;
  undefined1 local_58 [8];
  World world;
  
  world.m_objects.
  super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this = (Color *)(stripes.super_Pattern.m_transformation.m_buffer[3] + 3);
  ::image::Color::Color(this,1.0,1.0,1.0);
  scene::World::World((World *)local_58,this);
  ::image::Color::Color(&local_178,0.8431372549019608,0.6980392156862745,1.0);
  ::image::Color::Color(&local_1a0,0.5764705882352941,0.8470588235294118,0.5803921568627451);
  math::identity();
  math::Matrix4d::scale
            (&local_220,(Matrix4d *)(gradient.super_Pattern.m_transformation.m_buffer[3] + 3),0.5,
             0.5,0.5);
  material::pattern::StripeMaterial::Pattern
            ((StripeMaterial *)local_160,&local_178,&local_1a0,&local_220,0.1,0.9,1.0,200.0,0.0,0.0,
             1.0);
  ::image::Color::Color(&local_3a8,0.8,0.0,0.0);
  ::image::Color::Color(&local_3c0,0.0,0.0,0.8);
  math::identity();
  math::Matrix4d::scale
            (&local_4c0,(Matrix4d *)(ring.super_Pattern.m_transformation.m_buffer[3] + 3),1.5,1.5,
             1.5);
  math::Matrix4d::rotate_y(&local_440,&local_4c0,1.0471966666666666);
  material::pattern::GradientMaterial::Pattern
            ((GradientMaterial *)local_390,&local_3a8,&local_3c0,&local_440,0.1,0.9,1.0,200.0,0.0,
             0.0,1.0);
  ::image::Color::Color(&local_648,0.8274509803921568,0.8509803921568627,0.9058823529411765);
  ::image::Color::Color(&local_660,0.5529411764705883,0.6,0.7294117647058823);
  math::identity();
  math::Matrix4d::scale
            (&local_7e0,(Matrix4d *)(grid.super_Pattern.m_transformation.m_buffer[3] + 3),0.25,0.25,
             0.25);
  math::Matrix4d::rotate_x(&local_760,&local_7e0,2.094393333333333);
  math::Matrix4d::rotate_y(&local_6e0,&local_760,-0.26179916666666664);
  material::pattern::RingMaterial::Pattern
            ((RingMaterial *)local_630,&local_648,&local_660,&local_6e0,0.1,0.9,0.9,200.0,0.0,0.0,
             1.0);
  ::image::Color::Color(&local_968,0.2,0.2,0.2);
  ::image::Color::Color(&local_980,0.7,0.7,0.7);
  math::identity();
  material::pattern::CheckerMaterial::Pattern
            ((CheckerMaterial *)local_950,&local_968,&local_980,
             (Matrix4d *)&floor.super_Primitive.parent,0.1,0.9,0.9,200.0,1.0,0.0,1.0);
  math::identity();
  std::make_shared<material::pattern::CheckerMaterial,material::pattern::CheckerMaterial&>
            ((CheckerMaterial *)&middle.super_Primitive.parent);
  std::shared_ptr<material::Material>::shared_ptr<material::pattern::CheckerMaterial,void>
            (&local_b30,
             (shared_ptr<material::pattern::CheckerMaterial> *)&middle.super_Primitive.parent);
  geometry::primitive::Plane::Primitive((Plane *)local_aa0,&local_b20,&local_b30);
  std::shared_ptr<material::Material>::~shared_ptr(&local_b30);
  std::shared_ptr<material::pattern::CheckerMaterial>::~shared_ptr
            ((shared_ptr<material::pattern::CheckerMaterial> *)&middle.super_Primitive.parent);
  math::identity();
  math::Matrix4d::translate(&local_c60,&local_ce0,-0.5,1.0,0.5);
  std::make_shared<material::pattern::GradientMaterial,material::pattern::GradientMaterial&>
            ((GradientMaterial *)&right.super_Primitive.parent);
  std::shared_ptr<material::Material>::shared_ptr<material::pattern::GradientMaterial,void>
            (&local_cf0,
             (shared_ptr<material::pattern::GradientMaterial> *)&right.super_Primitive.parent);
  geometry::primitive::Sphere::Primitive((Sphere *)local_be0,&local_c60,&local_cf0);
  std::shared_ptr<material::Material>::~shared_ptr(&local_cf0);
  std::shared_ptr<material::pattern::GradientMaterial>::~shared_ptr
            ((shared_ptr<material::pattern::GradientMaterial> *)&right.super_Primitive.parent);
  math::identity();
  math::Matrix4d::scale(&local_ea0,&local_f20,0.5,0.5,0.5);
  math::Matrix4d::translate(&local_e20,&local_ea0,1.2,0.5,-0.5);
  std::make_shared<material::pattern::RingMaterial,material::pattern::RingMaterial&>
            ((RingMaterial *)&left.super_Primitive.parent);
  std::shared_ptr<material::Material>::shared_ptr<material::pattern::RingMaterial,void>
            (&local_f30,(shared_ptr<material::pattern::RingMaterial> *)&left.super_Primitive.parent)
  ;
  geometry::primitive::Sphere::Primitive((Sphere *)local_da0,&local_e20,&local_f30);
  std::shared_ptr<material::Material>::~shared_ptr(&local_f30);
  std::shared_ptr<material::pattern::RingMaterial>::~shared_ptr
            ((shared_ptr<material::pattern::RingMaterial> *)&left.super_Primitive.parent);
  math::identity();
  math::Matrix4d::scale(&local_1160,&local_11e0,0.33,0.33,0.33);
  math::Matrix4d::translate(&local_10e0,&local_1160,-1.5,0.33,-1.5);
  math::Matrix4d::rotate_y(&local_1060,&local_10e0,0.7853975);
  std::make_shared<material::pattern::StripeMaterial,material::pattern::StripeMaterial&>
            ((StripeMaterial *)&spheres.m_bounds.field_0x38);
  std::shared_ptr<material::Material>::shared_ptr<material::pattern::StripeMaterial,void>
            (&local_11f0,
             (shared_ptr<material::pattern::StripeMaterial> *)&spheres.m_bounds.field_0x38);
  geometry::primitive::Sphere::Primitive((Sphere *)local_fe0,&local_1060,&local_11f0);
  std::shared_ptr<material::Material>::~shared_ptr(&local_11f0);
  std::shared_ptr<material::pattern::StripeMaterial>::~shared_ptr
            ((shared_ptr<material::pattern::StripeMaterial> *)&spheres.m_bounds.field_0x38);
  math::identity();
  ::image::Color::Color((Color *)(key.m_position.m_buffer + 3),0.8,0.8,0.8);
  material::ColorMaterial::ColorMaterial
            (&local_13f0,(Color *)(key.m_position.m_buffer + 3),0.1,0.9,0.9,200.0,0.0,0.0,1.0);
  std::make_shared<material::ColorMaterial,material::ColorMaterial>((ColorMaterial *)local_1398);
  std::shared_ptr<material::Material>::shared_ptr<material::ColorMaterial,void>
            ((shared_ptr<material::Material> *)(local_1398 + 0x10),
             (shared_ptr<material::ColorMaterial> *)local_1398);
  geometry::Group::Group
            ((Group *)local_12f8,&local_1378,(shared_ptr<material::Material> *)(local_1398 + 0x10));
  std::shared_ptr<material::Material>::~shared_ptr
            ((shared_ptr<material::Material> *)(local_1398 + 0x10));
  std::shared_ptr<material::ColorMaterial>::~shared_ptr
            ((shared_ptr<material::ColorMaterial> *)local_1398);
  geometry::Group::add_child((Group *)local_12f8,(Primitive *)local_da0);
  geometry::Group::add_child((Group *)local_12f8,(Primitive *)local_fe0);
  geometry::Group::add_child((Group *)local_12f8,(Primitive *)local_be0);
  scene::World::add_object((World *)local_58,(Primitive *)local_aa0);
  scene::World::add_object((World *)local_58,(Primitive *)local_12f8);
  ::image::Color::Color(&local_1460,1.0,1.0,1.0);
  math::point((Tuple4d *)(fill.m_position.m_buffer + 3),-5.0,5.0,-5.0);
  scene::light::PointLight::PointLight
            ((PointLight *)local_1448,&local_1460,(Tuple4d *)(fill.m_position.m_buffer + 3));
  ::image::Color::Color(&local_14d8,1.0,1.0,1.0);
  math::point((Tuple4d *)&camera.m_half_height,10.0,10.0,-10.0);
  scene::light::PointLight::PointLight
            ((PointLight *)local_14c0,&local_14d8,(Tuple4d *)&camera.m_half_height);
  scene::World::add_light((World *)local_58,(Light *)local_1448);
  scene::World::add_light((World *)local_58,(Light *)local_14c0);
  ::image::Camera::Camera((Camera *)(from.m_buffer + 3),0x640,800,1.0471966666666666);
  math::point((Tuple4d *)(to.m_buffer + 3),0.0,1.5,-5.0);
  math::point((Tuple4d *)(up.m_buffer + 3),0.0,1.0,0.0);
  math::vector((Tuple4d *)local_15f8,0.0,1.0,0.0);
  math::view((Matrix4d *)&start,(Tuple4d *)(to.m_buffer + 3),(Tuple4d *)(up.m_buffer + 3),
             (Tuple4d *)local_15f8);
  ::image::Camera::transform((Camera *)(from.m_buffer + 3),(Matrix4d *)&start);
  image.m_resources = (int *)std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Rendering image...\n");
  ::image::Camera::render((Framebuffer *)&stop,(Camera *)(from.m_buffer + 3),(World *)local_58);
  local_16a0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"Finished in ");
  local_16b0.__r =
       (rep)std::chrono::operator-
                      (&local_16a0,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&image.m_resources);
  local_16a8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (&local_16b0);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_16a8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds!\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16d0,"example.ppm",&local_16d1);
  ::image::Framebuffer::save_buffer((Framebuffer *)&stop,&local_16d0);
  std::__cxx11::string::~string((string *)&local_16d0);
  std::allocator<char>::~allocator(&local_16d1);
  std::operator<<((ostream *)&std::cout,"Press any key to exit.\n");
  world.m_objects.
  super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  ::image::Framebuffer::~Framebuffer((Framebuffer *)&stop);
  geometry::Group::~Group((Group *)local_12f8);
  geometry::primitive::Sphere::~Sphere((Sphere *)local_fe0);
  geometry::primitive::Sphere::~Sphere((Sphere *)local_da0);
  geometry::primitive::Sphere::~Sphere((Sphere *)local_be0);
  geometry::primitive::Plane::~Plane((Plane *)local_aa0);
  scene::World::~World((World *)local_58);
  return world.m_objects.
         super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
    // create world
    scene::World world{};

    // setup materials
    material::pattern::StripeMaterial stripes{image::Color{215 / 255.0, 178 / 255.0, 255 / 255.0}, image::Color{147 / 255.0, 216 / 255.0, 148 / 255.0}, math::identity().scale(0.5, 0.5, 0.5), 0.1, 0.9, 1, 200};
    material::pattern::GradientMaterial gradient{image::Color{0.8, 0, 0}, image::Color{0, 0, 0.8}, math::identity().scale(1.5, 1.5, 1.5).rotate_y(constants::PI / 3), 0.1, 0.9, 1, 200};
    material::pattern::RingMaterial ring{image::Color{211 / 255.0, 217 / 255.0, 231 / 255.0}, image::Color{141 / 255.0, 153 / 255.0, 186 / 255.0}, math::identity().scale(0.25, 0.25, 0.25).rotate_x(constants::PI / 1.5).rotate_y(-constants::PI / 12)};
    material::pattern::CheckerMaterial grid{image::Color{0.2, 0.2, 0.2}, image::Color{0.7, 0.7, 0.7}, math::identity(), 0.1, 0.9, 0.9, 200, 1};

    // create objects with materials
    geometry::primitive::Plane floor{math::identity(), std::make_shared<material::pattern::CheckerMaterial>(grid)};
    geometry::primitive::Sphere middle{math::identity().translate(-0.5, 1, 0.5), std::make_shared<material::pattern::GradientMaterial>(gradient)};
    geometry::primitive::Sphere right{math::identity().scale(0.5, 0.5, 0.5).translate(1.2, 0.5, -0.5), std::make_shared<material::pattern::RingMaterial>(ring)};
    geometry::primitive::Sphere left{math::identity().scale(0.33, 0.33, 0.33).translate(-1.5, 0.33, -1.5).rotate_y(constants::PI / 4), std::make_shared<material::pattern::StripeMaterial>(stripes)};
    
    // group spheres together
    geometry::Group spheres{};
    spheres.add_child(&right);
    spheres.add_child(&left);
    spheres.add_child(&middle);

    // add objects to scene
    world.add_object(floor);
    world.add_object(spheres);

    // create lights
    scene::light::PointLight key{image::Color{1, 1, 1}, math::point(-5, 5, -5)};
    scene::light::PointLight fill{image::Color{1, 1, 1}, math::point(10, 10, -10)};

    // add lights to scene
    world.add_light(key);
    world.add_light(fill);

    // configure camera
    image::Camera camera{1600, 800, constants::PI / 3};
    math::Tuple4d from = math::point(0, 1.5, -5);
    math::Tuple4d to = math::point(0, 1, 0);
    math::Tuple4d up = math::vector(0, 1, 0);
    camera.transform(math::view(from, to, up));

    // render scene to buffer
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Rendering image...\n";
    image::Framebuffer image = camera.render(world);
    auto stop = std::chrono::high_resolution_clock::now();
    std::cout << "Finished in " << (std::chrono::duration_cast<std::chrono::seconds>(stop - start)).count() << " seconds!\n";

    // write buffer to file
    image.save_buffer("example.ppm");
    std::cout << "Press any key to exit.\n";

    return 0;
}